

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_destroy(Curl_hash *h)

{
  int local_14;
  int i;
  Curl_hash *h_local;
  
  if (h->table != (Curl_llist *)0x0) {
    for (local_14 = 0; local_14 < h->slots; local_14 = local_14 + 1) {
      Curl_llist_destroy(h->table + local_14,h);
    }
    (*Curl_cfree)(h->table);
    h->table = (Curl_llist *)0x0;
  }
  h->size = 0;
  h->slots = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  if(h->table) {
    int i;
    for(i = 0; i < h->slots; ++i) {
      Curl_llist_destroy(&h->table[i], (void *) h);
    }
    Curl_safefree(h->table);
  }
  h->size = 0;
  h->slots = 0;
}